

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,char8_t>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,int count,char8_t *value)

{
  ulong uVar1;
  char8_t cVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (0 < count) {
    uVar3 = (out.container)->size_;
    do {
      uVar1 = uVar3 + 1;
      uVar4 = uVar3;
      uVar3 = uVar1;
      if ((out.container)->capacity_ < uVar1) {
        (**(out.container)->_vptr_buffer)(out.container);
        uVar4 = (out.container)->size_;
        uVar3 = uVar4 + 1;
      }
      cVar2 = *value;
      (out.container)->size_ = uVar3;
      (out.container)->ptr_[uVar4] = cVar2;
      count = count + -1;
    } while (count != 0);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}